

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O3

void Packet::printPacket(char *buf,size_t len)

{
  ulong uVar1;
  
  if (len != 0) {
    uVar1 = 0;
    do {
      if ((uVar1 & 7) == 0) {
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
        std::ostream::put('\x18');
        std::ostream::flush();
      }
      printf("%02hhx|",(ulong)(uint)(int)buf[uVar1]);
      uVar1 = uVar1 + 1;
    } while (len != uVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  return;
}

Assistant:

void Packet::printPacket(const char* const buf, const size_t len) {
  for (size_t i = 0; i < len; ++i) {
    if (i % 8 == 0) {
      std::cout << std::endl;
    }
    printf("%02hhx|", buf[i]);
  }
  std::cout << std::endl;
}